

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O3

int Fxch_ManDivSingleCube(Fxch_Man_t *pFxchMan,int iCube,int fAdd,int fUpdate)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  
  if ((iCube < 0) || (pFxchMan->vCubes->nSize <= iCube)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar3 = pFxchMan->vCubes->pArray;
  iVar12 = pVVar3[(uint)iCube].nSize;
  if (1 < iVar12) {
    lVar8 = 2;
    lVar7 = 1;
    do {
      lVar9 = lVar7 + 1;
      lVar5 = (long)iVar12;
      if (lVar9 < lVar5) {
        iVar1 = pVVar3[(uint)iCube].pArray[lVar7];
        lVar7 = lVar8;
        do {
          iVar12 = pVVar3[(uint)iCube].pArray[lVar7];
          if (iVar12 <= iVar1) {
            __assert_fail("Lit0 < Lit1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxch/FxchMan.c"
                          ,0x47,"int Fxch_ManDivSingleCube(Fxch_Man_t *, int, int, int)");
          }
          p = pFxchMan->vCubeFree;
          p->nSize = 0;
          if (iVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          Vec_IntPush(p,iVar1 * 2 ^ 2);
          Vec_IntPush(pFxchMan->vCubeFree,iVar12 * 2 ^ 3);
          uVar2 = pFxchMan->nSizeOutputID;
          uVar4 = uVar2 * iCube;
          if (((int)uVar4 < 0) || (pFxchMan->vOutputID->nSize <= (int)uVar4)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          if ((int)uVar2 < 1) {
            iVar12 = 0;
          }
          else {
            uVar6 = 0;
            iVar12 = 0;
            do {
              uVar11 = pFxchMan->vOutputID->pArray[uVar4 + uVar6];
              uVar11 = (uVar11 >> 1 & 0x55555555) + (uVar11 & 0x55555555);
              uVar11 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
              uVar11 = (uVar11 >> 4 & 0x7070707) + (uVar11 & 0x7070707);
              uVar11 = (uVar11 >> 8 & 0xf000f) + (uVar11 & 0xf000f);
              iVar12 = (uVar11 >> 0x10) + iVar12 + (uVar11 & 0xffff);
              uVar6 = uVar6 + 1;
            } while (uVar2 != uVar6);
          }
          iVar12 = iVar12 + (uint)(iVar12 == 0);
          if (fAdd == 0) {
            do {
              Fxch_DivRemove(pFxchMan,fUpdate,1,0);
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
            iVar10 = -1;
          }
          else {
            do {
              iVar10 = 1;
              Fxch_DivAdd(pFxchMan,fUpdate,1,0);
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          pFxchMan->nPairsS = pFxchMan->nPairsS + iVar10;
          lVar7 = lVar7 + 1;
          iVar12 = pVVar3[(uint)iCube].nSize;
        } while ((int)lVar7 < iVar12);
        lVar5 = (long)iVar12;
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar9;
    } while (lVar9 < lVar5);
  }
  return iVar12;
}

Assistant:

static inline int Fxch_ManDivSingleCube( Fxch_Man_t* pFxchMan,
                                         int iCube,
                                         int fAdd,
                                         int fUpdate )
{
    Vec_Int_t* vCube = Vec_WecEntry( pFxchMan->vCubes, iCube );
    int i, k,
        Lit0,
        Lit1,
        fSingleCube = 1,
        fBase = 0;

    if ( Vec_IntSize( vCube ) < 2 )
        return 0;

    Vec_IntForEachEntryStart( vCube, Lit0, i, 1)
    Vec_IntForEachEntryStart( vCube, Lit1, k, (i + 1) )
    {
        int * pOutputID, nOnes, j, z;
        assert( Lit0 < Lit1 );

        Vec_IntClear( pFxchMan->vCubeFree );
        Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( Abc_LitNot( Lit0 ), 0 ) );
        Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( Abc_LitNot( Lit1 ), 1 ) );

        pOutputID = Vec_IntEntryP( pFxchMan->vOutputID, iCube * pFxchMan->nSizeOutputID );
        nOnes = 0;

        for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
            nOnes += Fxch_CountOnes( pOutputID[j] );

        if ( nOnes == 0 )
            nOnes = 1;

        if (fAdd)
        {
            for ( z = 0; z < nOnes; z++ )
                Fxch_DivAdd( pFxchMan, fUpdate, fSingleCube, fBase );
            pFxchMan->nPairsS++;
        }
        else
        {
            for ( z = 0; z < nOnes; z++ )
                Fxch_DivRemove( pFxchMan, fUpdate, fSingleCube, fBase );
            pFxchMan->nPairsS--;
        }
    }

    return Vec_IntSize( vCube ) * ( Vec_IntSize( vCube ) - 1 ) / 2;
}